

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

void __thiscall CentralBroker::create(CentralBroker *this,char *endP)

{
  _Bool _Var1;
  bool bVar2;
  int iVar3;
  zactor_t *pzVar4;
  zrex_t *self;
  char *pcVar5;
  BrokerClient *this_00;
  allocator local_41;
  zrex_t *addr_rex;
  string local_38;
  
  this->initialized = false;
  std::__cxx11::string::assign((char *)&this->endpoint);
  pzVar4 = zactor_new(mlm_server,(void *)0x0);
  this->broker = pzVar4;
  zsock_send(pzVar4,"ss","BIND",(this->endpoint)._M_dataplus._M_p);
  zsock_send(this->broker,"sss","SET","server/timeout","5000");
  self = zrex_new("(.*):(\\d*)");
  addr_rex = self;
  _Var1 = zrex_matches(self,endP);
  if (!_Var1) {
    std::operator<<((ostream *)&std::cout,
                    "Error: Could not start broker handle. (CentralBroker::CentralBroker)\n");
  }
  zrex_hit(self,1);
  std::__cxx11::string::assign((char *)&this->address);
  pcVar5 = zrex_hit(self,2);
  std::__cxx11::string::string((string *)&local_38,pcVar5,&local_41);
  iVar3 = std::__cxx11::stoi(&local_38,(size_t *)0x0,10);
  this->port = iVar3;
  std::__cxx11::string::~string((string *)&local_38);
  zrex_destroy(&addr_rex);
  this_00 = (BrokerClient *)operator_new(0x130);
  BrokerClient::BrokerClient
            (this_00,"Broker",(this->address)._M_dataplus._M_p,this->port,this->broker);
  this->brokerHandle = this_00;
  bVar2 = BrokerClient::start(this_00);
  if (bVar2) {
    pzVar4 = zactor_new(logging_reactor_task,this);
    this->logger = pzVar4;
    this->initialized = true;
  }
  return;
}

Assistant:

void CentralBroker::create(const char *endP){
    initialized = false;
    endpoint.assign(endP);

    broker = zactor_new(mlm_server, NULL);

    //Bind broker to endpoint
    zsock_send(broker, "ss", "BIND", endpoint.c_str());
    //Set server timeouts to be 5000 ms
    zsock_send (broker, "sss", "SET", "server/timeout", "5000");

    //group 1 = anything before the colon, address
    //group 2 = any number of digits after colon, port
    zrex_t *addr_rex = zrex_new("(.*):(\\d*)");
    if(!zrex_matches(addr_rex, endP)){
        std::cout << "Error: Could not start broker handle. (CentralBroker::CentralBroker)\n";
    }
    address.assign(zrex_hit(addr_rex, 1));
    port = std::stoi(zrex_hit(addr_rex, 2));
    zrex_destroy(&addr_rex);

    //Start broker client
    brokerHandle = new BrokerClient(BROKER_NETWORK_ID, address.c_str(), port, broker);
    if(!brokerHandle->start()){
        return;
    }

    //Create thread for Broker Client that forwards logs to itself and parses it
    //TODO: just integrate this into the BrokerClient class
    logger = zactor_new(&CentralBroker::logging_reactor_task, this);
    initialized = true;
}